

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>::
TPZFrontMatrix(TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>
               *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  TPZVec<int> *this_01;
  void **in_stack_ffffffffffffffb8;
  TPZAbstractFrontMatrix<long_double> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<long_double,TPZStackEqnStorage<long_double>,TPZFrontSym<long_double>>>
            (in_RDI,0x21);
  TPZAbstractFrontMatrix<long_double>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZFrontMatrix_025436e8;
  TPZStackEqnStorage<long_double>::TPZStackEqnStorage
            ((TPZStackEqnStorage<long_double> *)(in_RDI + 0x20));
  this_00 = in_RDI + 0x33310;
  TPZFrontSym<long_double>::TPZFrontSym((TPZFrontSym<long_double> *)this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x33448);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x33468));
  TPZFrontSym<long_double>::Reset((TPZFrontSym<long_double> *)this_00,(int64_t)this_01);
  TPZStackEqnStorage<long_double>::Reset((TPZStackEqnStorage<long_double> *)0x1ce3c69);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RDI + 0x33440) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x33438) = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}